

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void CVmObjDict::save_file_cb(void *ctx0,CVmHashEntry *entry0)

{
  size_t sVar1;
  int iVar2;
  char *buf;
  CVmHashEntryDict *in_RSI;
  size_t *in_RDI;
  uint cnt;
  vm_dict_entry *cur;
  CVmHashEntryDict *entry;
  save_file_ctx *ctx;
  uint v;
  CVmFile *in_stack_ffffffffffffffc0;
  CVmObjTable *this;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  vm_dict_entry *local_28;
  
  sVar1 = *in_RDI;
  CVmHashEntry::getlen((CVmHashEntry *)in_RSI);
  v = (uint)(sVar1 >> 0x20);
  CVmFile::write_uint2(in_stack_ffffffffffffffc0,v);
  this = (CVmObjTable *)*in_RDI;
  buf = CVmHashEntry::getstr((CVmHashEntry *)in_RSI);
  CVmHashEntry::getlen((CVmHashEntry *)in_RSI);
  CVmFile::write_bytes
            ((CVmFile *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),buf,
             (size_t)this);
  iVar3 = 0;
  for (local_28 = CVmHashEntryDict::get_head(in_RSI); local_28 != (vm_dict_entry *)0x0;
      local_28 = local_28->nxt_) {
    iVar2 = CVmObjTable::is_obj_persistent(this,v);
    if (iVar2 != 0) {
      iVar3 = iVar3 + 1;
    }
  }
  if (iVar3 != 0) {
    in_RDI[1] = in_RDI[1] + 1;
    CVmFile::write_uint2((CVmFile *)this,v);
    for (local_28 = CVmHashEntryDict::get_head(in_RSI); local_28 != (vm_dict_entry *)0x0;
        local_28 = local_28->nxt_) {
      iVar3 = CVmObjTable::is_obj_persistent(this,v);
      if (iVar3 != 0) {
        CVmFile::write_uint4((CVmFile *)this,v);
        CVmFile::write_uint2((CVmFile *)this,v);
      }
    }
  }
  return;
}

Assistant:

void CVmObjDict::save_file_cb(void *ctx0, CVmHashEntry *entry0)
{
    save_file_ctx *ctx = (save_file_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    vm_dict_entry *cur;
    uint cnt;

    /* set up global access */
    VMGLOB_PTR(ctx->vmg);

    /* write out this entry's name */
    ctx->fp->write_uint2(entry->getlen());
    ctx->fp->write_bytes(entry->getstr(), entry->getlen());

    /* count the items in this entry's list */
    for (cnt = 0, cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
    {
        /* 
         *   if the referenced object is persistent, count this item;
         *   don't count items that refer to non-persistent items, because
         *   these objects will not be saved to the file and hence will
         *   not be present when the saved state is restored 
         */
        if (G_obj_table->is_obj_persistent(cur->obj_))
            ++cnt;
    }

    /* 
     *   if there are no saveable items for this entry, do not write out
     *   the entry at all 
     */
    if (cnt == 0)
        return;

    /* count this entry */
    ++ctx->cnt;

    /* write the item count */
    ctx->fp->write_uint2(cnt);

    /* write out each item in this entry's list */
    for (cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
    {
        /* if this item's object is persistent, write out the item */
        if (G_obj_table->is_obj_persistent(cur->obj_))
        {
            /* write out the object and property for this entry */
            ctx->fp->write_uint4((long)cur->obj_);
            ctx->fp->write_uint2((int)cur->prop_);
        }
    }
}